

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPUDPv6TransmissionParams::RTPUDPv6TransmissionParams(RTPUDPv6TransmissionParams *this)

{
  int local_14;
  int i;
  RTPUDPv6TransmissionParams *this_local;
  
  RTPTransmissionParams::RTPTransmissionParams(&this->super_RTPTransmissionParams,IPv6UDPProto);
  (this->super_RTPTransmissionParams)._vptr_RTPTransmissionParams =
       (_func_int **)&PTR__RTPUDPv6TransmissionParams_001ae508;
  std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::list(&this->localIPs);
  *(undefined2 *)&(this->super_RTPTransmissionParams).field_0xc = 5000;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    (this->bindIP).__in6_u.__u6_addr8[local_14] = '\0';
  }
  this->multicastTTL = '\x01';
  this->mcastifidx = 0;
  this->rtpsendbuf = 0x8000;
  this->rtprecvbuf = 0x8000;
  this->rtcpsendbuf = 0x8000;
  this->rtcprecvbuf = 0x8000;
  this->m_pAbortDesc = (RTPAbortDescriptors *)0x0;
  return;
}

Assistant:

inline RTPUDPv6TransmissionParams::RTPUDPv6TransmissionParams()
	: RTPTransmissionParams(RTPTransmitter::IPv6UDPProto)	
{ 
	portbase = RTPUDPV6TRANS_DEFAULTPORTBASE; 
	for (int i = 0 ; i < 16 ; i++) 
		bindIP.s6_addr[i] = 0; 

	multicastTTL = 1; 
	mcastifidx = 0; 
	rtpsendbuf = RTPUDPV6TRANS_RTPTRANSMITBUFFER; 
	rtprecvbuf= RTPUDPV6TRANS_RTPRECEIVEBUFFER; 
	rtcpsendbuf = RTPUDPV6TRANS_RTCPTRANSMITBUFFER; 
	rtcprecvbuf = RTPUDPV6TRANS_RTCPRECEIVEBUFFER; 

	m_pAbortDesc = 0;
}